

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExprNode * __thiscall Parser::call(Parser *this,Token *id)

{
  bool bVar1;
  int iVar2;
  CallExpr *this_00;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> local_268;
  Token local_250;
  CallExpr *local_1e0;
  CallExpr *callExpr;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  undefined1 local_188 [8];
  Token closeParen;
  int local_10c;
  undefined1 local_108 [4];
  int i;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> newArray;
  Testlist *callTestlist;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_88 [8];
  Token openParen;
  Token *id_local;
  Parser *this_local;
  
  openParen._string.field_2._8_8_ = id;
  Tokenizer::getToken((Token *)local_88,this->tokenizer);
  bVar1 = Token::isOpenParen((Token *)local_88);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Parser::callStmt",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Expected an ( sign, instead got",
               (allocator<char> *)((long)&callTestlist + 7));
    die(this,&local_b8,&local_e0,(Token *)local_88);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&callTestlist + 7));
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  newArray.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)testList(this);
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector
            ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)local_108);
  local_10c = 0;
  while( true ) {
    iVar2 = Testlist::numTests((Testlist *)
                               newArray.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar2 <= local_10c) break;
    closeParen._string.field_2._8_8_ =
         Testlist::at((Testlist *)
                      newArray.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,local_10c);
    std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::push_back
              ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)local_108,
               (value_type *)((long)&closeParen._string.field_2 + 8));
    local_10c = local_10c + 1;
  }
  Tokenizer::getToken((Token *)local_188,this->tokenizer);
  bVar1 = Token::isCloseParen((Token *)local_188);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"Parser::callStmt",&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"Expected an ) sign, instead got",
               (allocator<char> *)((long)&callExpr + 7));
    die(this,&local_1a8,&local_1d0,(Token *)local_188);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&callExpr + 7));
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
  }
  this_00 = (CallExpr *)operator_new(0xa0);
  Token::Token(&local_250,id);
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector
            (&local_268,(vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)local_108);
  CallExpr::CallExpr(this_00,&local_250,&local_268);
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::~vector(&local_268);
  Token::~Token(&local_250);
  local_1e0 = this_00;
  Token::~Token((Token *)local_188);
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::~vector
            ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)local_108);
  Token::~Token((Token *)local_88);
  return &this_00->super_ExprNode;
}

Assistant:

ExprNode *Parser::call(Token id) {
    Token openParen = tokenizer.getToken();
    if (!openParen.isOpenParen())
        die("Parser::callStmt", "Expected an ( sign, instead got", openParen);
    Testlist *callTestlist = testList();
    std::vector<ExprNode*>newArray;
    for(int i = 0; i < callTestlist->numTests();i++){
        newArray.push_back(callTestlist->at(i));
    }
    Token closeParen = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::callStmt", "Expected an ) sign, instead got", closeParen);
//    CallStatement *callStatement = new CallStatement(id.getName(), callTestlist);
    auto *callExpr = new CallExpr(id, newArray);

    return callExpr;
    //CallExpr *callExpr = new CallExpr()
    //callToken.setWholeNumber(callStatement->evaluate());
    //return new WholeNumber(callToken);

}